

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_mgga_xc_kcis.c
# Opt level: O0

void hyb_mgga_xc_kcis_init(xc_func_type *p)

{
  int *funcs_id_00;
  xc_func_type *in_RDI;
  double funcs_coef [2];
  int funcs_id [2];
  double exx;
  int xid;
  double *in_stack_ffffffffffffffb8;
  double local_18;
  
  funcs_id_00 = (int *)(ulong)(in_RDI->info->number - 0x236);
  switch(funcs_id_00) {
  case (int *)0x0:
    local_18 = 0.15;
    break;
  case (int *)0x1:
    local_18 = 0.41;
    break;
  case (int *)0x2:
    local_18 = 0.22;
    break;
  case (int *)0x3:
    local_18 = 0.13;
    break;
  default:
    fprintf(_stderr,"Internal error in hyb_mgga_xc_kcis\n");
    exit(1);
  }
  xc_mix_init((xc_func_type *)0x3ff0000000000000,(int)((ulong)(1.0 - local_18) >> 0x20),funcs_id_00,
              in_stack_ffffffffffffffb8);
  xc_hyb_init_hybrid(in_RDI,local_18);
  return;
}

Assistant:

static void
hyb_mgga_xc_kcis_init(xc_func_type *p)
{
  /* Exchange functional */
  int xid;
  /* Fraction of exact exchange */
  double exx;
  /* Array */
  int funcs_id[2];
  double funcs_coef[2];

  switch(p->info->number){
  case XC_HYB_MGGA_XC_MPW1KCIS:
    xid=XC_GGA_X_MPW91;
    exx=0.15;
    break;
  case XC_HYB_MGGA_XC_MPWKCIS1K:
    xid=XC_GGA_X_MPW91;
    exx=0.41;
    break;
  case XC_HYB_MGGA_XC_PBE1KCIS:
    xid=XC_GGA_X_PBE;
    exx=0.22;
    break;
  case XC_HYB_MGGA_XC_TPSS1KCIS:
    xid=XC_MGGA_X_TPSS;
    exx=0.13;
    break;
  default:
    fprintf(stderr, "Internal error in hyb_mgga_xc_kcis\n");
    exit(1);
  }

  /* Initialize mix */
  funcs_id[0] = xid;
  funcs_coef[0] = 1.0 - exx;

  funcs_id[1] = XC_MGGA_C_KCIS;
  funcs_coef[1] = 1.0;

  xc_mix_init(p, 2, funcs_id, funcs_coef);
  xc_hyb_init_hybrid(p, exx);
}